

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float32_suite::fail_array32_float32_missing_one(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [8];
  
  decoder.current.view._M_str = (uchar *)0x80000000000004cd;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[8]>
            ((decoder *)local_38,(uchar (*) [8])&decoder.current.view._M_str);
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdda,"void compact_float32_suite::fail_array32_float32_missing_one()",local_40,
             &local_44);
  return;
}

Assistant:

void fail_array32_float32_missing_one()
{
    const value_type input[] = { token::code::array32_float32, 0x04, 0x00, 0x00, 0x00, 0x00, 0x00, 0x80 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}